

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_helper.cpp
# Opt level: O0

pair<double,_double>
Performance_Test::runPerformanceTest(performanceFunction function,uint32_t size)

{
  undefined4 in_ESI;
  code *in_RDI;
  BaseTimerContainer *unaff_retaddr;
  TimerContainer timer;
  TimerContainer *in_stack_ffffffffffffffa0;
  undefined1 local_40 [36];
  undefined4 local_1c;
  code *local_18;
  pair<double,_double> local_10;
  
  local_1c = in_ESI;
  local_18 = in_RDI;
  TimerContainer::TimerContainer(in_stack_ffffffffffffffa0);
  (*local_18)(local_40,local_1c);
  local_10 = BaseTimerContainer::mean(unaff_retaddr);
  TimerContainer::~TimerContainer((TimerContainer *)0x170e66);
  return local_10;
}

Assistant:

std::pair < double, double > runPerformanceTest(performanceFunction function, uint32_t size )
    {
        Performance_Test::TimerContainer timer;
        function( timer, size  );
        return timer.mean();
    }